

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publications.cpp
# Opt level: O2

void __thiscall helics::Publication::publish(Publication *this,char val)

{
  bool val_00;
  string_view val_01;
  char val_local;
  
  switch(this->pubType) {
  case HELICS_STRING:
  case HELICS_NAMED_POINT:
  case HELICS_CHAR:
    val_01._M_str = &val_local;
    val_01._M_len = 1;
    publishString(this,val_01);
    return;
  default:
    publishInt(this,(long)val);
    return;
  case HELICS_BOOL:
    break;
  }
  val_00 = false;
  if (((0x39 < (int)val - 0x2dU) ||
      ((0x200000002000009U >> ((ulong)((int)val - 0x2dU) & 0x3f) & 1) == 0)) && (val != '\0')) {
    val_00 = true;
  }
  publish(this,val_00);
  return;
}

Assistant:

void Publication::publish(char val)
{
    switch (pubType) {
        case DataType::HELICS_BOOL:
            publish(!((val == '0') || (val == 'f') || (val == 0) || (val == 'F') || (val == '-')));
            break;
        case DataType::HELICS_STRING:
        case DataType::HELICS_NAMED_POINT:
        case DataType::HELICS_CHAR:
            publishString({&val, 1});
            break;
        default:
            publishInt(static_cast<int64_t>(val));
    }
}